

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O0

int mbedtls_gcm_update(mbedtls_gcm_context *ctx,uchar *input,size_t input_length,uchar *output,
                      size_t output_size,size_t *output_length)

{
  int iVar1;
  ulong offset_00;
  mbedtls_gcm_context *in_RCX;
  mbedtls_gcm_context *in_RDX;
  mbedtls_gcm_context *in_RSI;
  long in_RDI;
  mbedtls_gcm_context *in_R8;
  ulong *in_R9;
  size_t use_len;
  uchar ectr [16];
  size_t offset;
  uchar *out_p;
  uchar *p;
  int ret;
  uchar *in_stack_ffffffffffffff88;
  mbedtls_gcm_context *in_stack_ffffffffffffff90;
  uchar *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  mbedtls_gcm_context *ectr_00;
  mbedtls_gcm_context *ctx_00;
  mbedtls_gcm_context *local_20;
  int local_4;
  
  ectr_00 = in_RCX;
  ctx_00 = in_RSI;
  memset(&stack0xffffffffffffff98,0,0x10);
  if (in_R8 < in_RDX) {
    local_4 = -0x16;
  }
  else {
    *in_R9 = (ulong)in_RDX;
    if (in_RDX == (mbedtls_gcm_context *)0x0) {
      local_4 = 0;
    }
    else if ((in_RSI < in_RCX) && ((mbedtls_gcm_context *)((long)in_RCX - (long)in_RSI) < in_RDX)) {
      local_4 = -0x14;
    }
    else if (((in_RDX->cipher_ctx).unprocessed_data + *(long *)(in_RDI + 0x148) + -0x10 <
              *(undefined1 **)(in_RDI + 0x148)) ||
            ((uchar *)0xfffffffe0 <
             (in_RDX->cipher_ctx).unprocessed_data + *(long *)(in_RDI + 0x148) + -0x10)) {
      local_4 = -0x14;
    }
    else {
      if ((*(long *)(in_RDI + 0x148) == 0) && ((*(ulong *)(in_RDI + 0x150) & 0xf) != 0)) {
        gcm_mult(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(uchar *)0x87b3da);
      }
      offset_00 = *(ulong *)(in_RDI + 0x148) & 0xf;
      local_20 = in_RDX;
      if (offset_00 != 0) {
        in_stack_ffffffffffffff90 = (mbedtls_gcm_context *)(0x10 - offset_00);
        if (in_RDX < (mbedtls_gcm_context *)(0x10 - offset_00)) {
          in_stack_ffffffffffffff90 = in_RDX;
        }
        iVar1 = gcm_mask(ctx_00,(uchar *)ectr_00,offset_00,in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff98,(uchar *)in_stack_ffffffffffffff90);
        if (iVar1 != 0) {
          return iVar1;
        }
        if ((in_stack_ffffffffffffff90->cipher_ctx).unprocessed_data + (offset_00 - 0x10) ==
            (uchar *)0x10) {
          gcm_mult(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(uchar *)0x87b48b);
        }
        *(uchar **)(in_RDI + 0x148) =
             (in_stack_ffffffffffffff90->cipher_ctx).unprocessed_data +
             *(long *)(in_RDI + 0x148) + -0x10;
        local_20 = (mbedtls_gcm_context *)((long)in_RDX - (long)in_stack_ffffffffffffff90);
        ctx_00 = (mbedtls_gcm_context *)
                 ((in_stack_ffffffffffffff90->cipher_ctx).unprocessed_data +
                 (long)((ctx_00->cipher_ctx).unprocessed_data + -0x20));
        ectr_00 = (mbedtls_gcm_context *)
                  ((in_stack_ffffffffffffff90->cipher_ctx).unprocessed_data +
                  (long)((ectr_00->cipher_ctx).unprocessed_data + -0x20));
      }
      *(uchar **)(in_RDI + 0x148) =
           (local_20->cipher_ctx).unprocessed_data + *(long *)(in_RDI + 0x148) + -0x10;
      for (; (mbedtls_gcm_context *)0xf < local_20;
          local_20 = (mbedtls_gcm_context *)(local_20[-1].buf + 8)) {
        gcm_incr((uchar *)(in_RDI + 0x168));
        iVar1 = gcm_mask(ctx_00,(uchar *)ectr_00,offset_00,in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff98,(uchar *)in_stack_ffffffffffffff90);
        if (iVar1 != 0) {
          return iVar1;
        }
        gcm_mult(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(uchar *)0x87b562);
        ctx_00 = (mbedtls_gcm_context *)(ctx_00->cipher_ctx).unprocessed_data;
        ectr_00 = (mbedtls_gcm_context *)(ectr_00->cipher_ctx).unprocessed_data;
      }
      if (local_20 != (mbedtls_gcm_context *)0x0) {
        gcm_incr((uchar *)(in_RDI + 0x168));
        iVar1 = gcm_mask(ctx_00,(uchar *)ectr_00,offset_00,in_stack_ffffffffffffffa0,
                         in_stack_ffffffffffffff98,(uchar *)in_stack_ffffffffffffff90);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      mbedtls_platform_zeroize(in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int mbedtls_gcm_update(mbedtls_gcm_context *ctx,
                       const unsigned char *input, size_t input_length,
                       unsigned char *output, size_t output_size,
                       size_t *output_length)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    const unsigned char *p = input;
    unsigned char *out_p = output;
    size_t offset;
    unsigned char ectr[16] = { 0 };

    if (output_size < input_length) {
        return MBEDTLS_ERR_GCM_BUFFER_TOO_SMALL;
    }
    *output_length = input_length;

    /* Exit early if input_length==0 so that we don't do any pointer arithmetic
     * on a potentially null pointer.
     * Returning early also means that the last partial block of AD remains
     * untouched for mbedtls_gcm_finish */
    if (input_length == 0) {
        return 0;
    }

    if (output > input && (size_t) (output - input) < input_length) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }

    /* Total length is restricted to 2^39 - 256 bits, ie 2^36 - 2^5 bytes
     * Also check for possible overflow */
    if (ctx->len + input_length < ctx->len ||
        (uint64_t) ctx->len + input_length > 0xFFFFFFFE0ull) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }

    if (ctx->len == 0 && ctx->add_len % 16 != 0) {
        gcm_mult(ctx, ctx->buf, ctx->buf);
    }

    offset = ctx->len % 16;
    if (offset != 0) {
        size_t use_len = 16 - offset;
        if (use_len > input_length) {
            use_len = input_length;
        }

        if ((ret = gcm_mask(ctx, ectr, offset, use_len, p, out_p)) != 0) {
            return ret;
        }

        if (offset + use_len == 16) {
            gcm_mult(ctx, ctx->buf, ctx->buf);
        }

        ctx->len += use_len;
        input_length -= use_len;
        p += use_len;
        out_p += use_len;
    }

    ctx->len += input_length;

    while (input_length >= 16) {
        gcm_incr(ctx->y);
        if ((ret = gcm_mask(ctx, ectr, 0, 16, p, out_p)) != 0) {
            return ret;
        }

        gcm_mult(ctx, ctx->buf, ctx->buf);

        input_length -= 16;
        p += 16;
        out_p += 16;
    }

    if (input_length > 0) {
        gcm_incr(ctx->y);
        if ((ret = gcm_mask(ctx, ectr, 0, input_length, p, out_p)) != 0) {
            return ret;
        }
    }

    mbedtls_platform_zeroize(ectr, sizeof(ectr));
    return 0;
}